

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

ssize_t __thiscall
de::BlockBuffer<unsigned_char>::read
          (BlockBuffer<unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  undefined8 *puVar2;
  int iVar3;
  
  if (this->m_canceled == 0) {
    deMutex_lock((this->m_readLock).m_mutex);
    if (0 < __fd) {
      iVar3 = 0;
      do {
        iVar1 = readFromCurrentBlock(this,__fd - iVar3,(uchar *)((long)__buf + (long)iVar3),true);
        iVar3 = iVar3 + iVar1;
      } while (iVar3 < __fd);
    }
    deMutex_unlock((this->m_readLock).m_mutex);
    return CONCAT44(extraout_var,extraout_EAX);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00150a58;
  __cxa_throw(puVar2,&BufferCanceledException::typeinfo,std::exception::~exception);
}

Assistant:

void BlockBuffer<T>::read (int numElements, T* elements)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_canceled)
		throw CanceledException();

	m_readLock.lock();

	int numRead = 0;
	while (numRead < numElements)
		numRead += readFromCurrentBlock(numElements-numRead, &elements[numRead], true /* blocking */);

	m_readLock.unlock();
}